

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::got_none::got_none(got_none *this,location *where_,text *expr_)

{
  allocator<char> local_c1;
  text local_c0;
  text local_a0;
  location local_80;
  allocator<char> local_41;
  text local_40;
  text *local_20;
  text *expr__local;
  location *where__local;
  got_none *this_local;
  
  local_20 = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"passed: got no exception",&local_41);
  location::location(&local_80,where_);
  std::__cxx11::string::string((string *)&local_a0,(string *)expr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  success::success(&this->super_success,&local_40,&local_80,&local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  location::~location(&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  *(undefined ***)&(this->super_success).super_message = &PTR__got_none_001a7a98;
  return;
}

Assistant:

got_none( location where_, text expr_)
    : success( "passed: got no exception", where_, expr_) {}